

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_clock_predicate
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *clock1,typed_expression_t *clock2,
          shared_ptr<const_tchecker::typed_expression_t> *bound,instruction_t instruction)

{
  expression_type_t type;
  invalid_argument *this_00;
  ineq_cmp_t cmp;
  typed_expression_t *ptVar1;
  typed_unary_expression_t *this_01;
  value_type_conflict2 local_68;
  typed_unary_expression_t neg_bound;
  
  type = type_neg(((bound->
                   super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->_type);
  this_01 = &neg_bound;
  typed_unary_expression_t::typed_unary_expression_t(this_01,type,EXPR_OP_NEG,bound);
  cmp = LE;
  ptVar1 = clock1;
  switch(instruction) {
  case VM_EQ:
    compile_clock_constraint
              (this,clock1,clock2,LE,
               (bound->
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    compile_clock_constraint(this,clock2,clock1,LE,&neg_bound.super_typed_expression_t);
    local_68 = 8;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (&this->_bytecode_back_inserter,&local_68);
    goto LAB_001447a6;
  case VM_GT:
    cmp = LT;
  case VM_GE:
    ptVar1 = clock2;
    break;
  case VM_LT:
    this_01 = (typed_unary_expression_t *)
              (bound->
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    cmp = LT;
    clock1 = clock2;
    break;
  case VM_LE:
    this_01 = (typed_unary_expression_t *)
              (bound->
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    clock1 = clock2;
    break;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"invalid instruction");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  compile_clock_constraint(this,ptVar1,clock1,cmp,&this_01->super_typed_expression_t);
LAB_001447a6:
  typed_unary_expression_t::~typed_unary_expression_t(&neg_bound);
  return;
}

Assistant:

void compile_clock_predicate(tchecker::typed_expression_t const & clock1, tchecker::typed_expression_t const & clock2,
                               std::shared_ptr<tchecker::typed_expression_t const> const & bound,
                               enum tchecker::instruction_t instruction)
  {
    // bound negation
    tchecker::typed_unary_expression_t neg_bound(tchecker::type_neg(bound->type()), tchecker::EXPR_OP_NEG, bound);

    // write bytecode
    if (instruction == tchecker::VM_LT)
      compile_clock_constraint(clock1, clock2, tchecker::LT, *bound);
    else if (instruction == tchecker::VM_LE)
      compile_clock_constraint(clock1, clock2, tchecker::LE, *bound);
    else if (instruction == tchecker::VM_GE)
      compile_clock_constraint(clock2, clock1, tchecker::LE, neg_bound);
    else if (instruction == tchecker::VM_GT)
      compile_clock_constraint(clock2, clock1, tchecker::LT, neg_bound);
    else if (instruction == tchecker::VM_EQ) {
      compile_clock_constraint(clock1, clock2, tchecker::LE, *bound);
      compile_clock_constraint(clock2, clock1, tchecker::LE, neg_bound);
      _bytecode_back_inserter = tchecker::VM_LAND;
    }
    else
      throw std::invalid_argument("invalid instruction");
  }